

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshSceneNode.cpp
# Opt level: O0

void __thiscall irr::scene::CMeshSceneNode::copyMaterials(CMeshSceneNode *this)

{
  ITexture *pIVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  SMaterial *in_RDI;
  IMeshBuffer *mb;
  u32 i;
  SMaterial mat;
  SMaterial *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  uint uVar4;
  SMaterial *in_stack_ffffffffffffff30;
  uint local_c4;
  
  core::array<irr::video::SMaterial>::clear
            ((array<irr::video::SMaterial> *)in_stack_ffffffffffffff30);
  if (in_RDI[2].TextureLayers[3].Texture != (ITexture *)0x0) {
    video::SMaterial::SMaterial(in_stack_ffffffffffffff30);
    local_c4 = 0;
    while( true ) {
      uVar4 = local_c4;
      uVar2 = (**(in_RDI[2].TextureLayers[3].Texture)->_vptr_ITexture)();
      if (uVar2 <= uVar4) break;
      pIVar1 = in_RDI[2].TextureLayers[3].Texture;
      iVar3 = (*pIVar1->_vptr_ITexture[1])(pIVar1,(ulong)local_c4);
      in_stack_ffffffffffffff30 = (SMaterial *)CONCAT44(extraout_var,iVar3);
      if (in_stack_ffffffffffffff30 != (SMaterial *)0x0) {
        (*(code *)(in_stack_ffffffffffffff30->TextureLayers[0].Texture)->_vptr_ITexture)();
        video::SMaterial::operator=(in_stack_ffffffffffffff30,in_RDI);
      }
      core::array<irr::video::SMaterial>::push_back
                ((array<irr::video::SMaterial> *)CONCAT44(uVar4,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff18);
      local_c4 = local_c4 + 1;
    }
    video::SMaterial::~SMaterial(in_stack_ffffffffffffff30);
  }
  return;
}

Assistant:

void CMeshSceneNode::copyMaterials()
{
	Materials.clear();

	if (Mesh) {
		video::SMaterial mat;

		for (u32 i = 0; i < Mesh->getMeshBufferCount(); ++i) {
			IMeshBuffer *mb = Mesh->getMeshBuffer(i);
			if (mb)
				mat = mb->getMaterial();

			Materials.push_back(mat);
		}
	}
}